

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

void __thiscall irr::gui::CGUITabControl::clear(CGUITabControl *this)

{
  u32 uVar1;
  IGUITab **ppIVar2;
  IGUIElement *in_RDI;
  IGUIElement *unaff_retaddr;
  u32 i;
  undefined4 in_stack_ffffffffffffffd8;
  u32 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  while( true ) {
    uVar4 = uVar3;
    uVar1 = core::array<irr::gui::IGUITab_*>::size((array<irr::gui::IGUITab_*> *)0x3cff94);
    if (uVar1 <= uVar3) break;
    ppIVar2 = core::array<irr::gui::IGUITab_*>::operator[]
                        ((array<irr::gui::IGUITab_*> *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffdc);
    if (*ppIVar2 != (IGUITab *)0x0) {
      core::array<irr::gui::IGUITab_*>::operator[]
                ((array<irr::gui::IGUITab_*> *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
      IGUIElement::removeChild(unaff_retaddr,in_RDI);
      core::array<irr::gui::IGUITab_*>::operator[]
                ((array<irr::gui::IGUITab_*> *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
      IReferenceCounted::drop
                ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
      ;
    }
    uVar3 = uVar4 + 1;
  }
  core::array<irr::gui::IGUITab_*>::clear
            ((array<irr::gui::IGUITab_*> *)CONCAT44(uVar4,in_stack_fffffffffffffff0));
  recalculateScrollBar((CGUITabControl *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

void CGUITabControl::clear()
{
	for (u32 i = 0; i < Tabs.size(); ++i) {
		if (Tabs[i]) {
			IGUIElement::removeChild(Tabs[i]);
			Tabs[i]->drop();
		}
	}
	Tabs.clear();

	recalculateScrollBar();
}